

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O0

iuParamGenerator<std::tuple<bool,_int>_> * __thiscall
iutest::detail::iuParamGenerator<std::tuple<bool,_int>_>::operator=
          (iuParamGenerator<std::tuple<bool,_int>_> *this,
          iuParamGenerator<std::tuple<bool,_int>_> *param_1)

{
  iuParamGenerator<std::tuple<bool,_int>_> *param_1_local;
  iuParamGenerator<std::tuple<bool,_int>_> *this_local;
  
  iuIParamGenerator<std::tuple<bool,_int>_>::operator=
            (&this->super_iuIParamGenerator<std::tuple<bool,_int>_>,
             &param_1->super_iuIParamGenerator<std::tuple<bool,_int>_>);
  this->m_pInterface = param_1->m_pInterface;
  return this;
}

Assistant:

class iuParamGenerator IUTEST_CXX_FINAL : public iuIParamGenerator<T>
{
    typedef iuIParamGenerator<T> _Interface;
    typedef iuParamGenerator<T>  _Myt;
public:
    typedef T type;
public:
    iuParamGenerator(_Interface* pInterface=NULL) : m_pInterface(pInterface) {} // NOLINT

public:
    operator iuIParamGenerator<T>* () const { return m_pInterface; }

public:
#if IUTEST_HAS_CONCAT
    template<typename Other>
    iuConcatParamHolder<_Myt, Other> operator + (const Other& g) const
    {
        return iuConcatParamHolder<_Myt, Other>(*this, g);
    }
#endif

public:
    virtual void    Begin() IUTEST_CXX_OVERRIDE { m_pInterface->Begin(); }